

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  vw *pvVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  cb_adf *pcVar7;
  _func_int ***__dest;
  option_group_definition *poVar8;
  long *__dest_00;
  base_learner *l;
  multi_learner *base;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  long lVar10;
  size_t ws;
  undefined **ppuVar11;
  label_parser *plVar12;
  size_t sVar13;
  byte bVar14;
  bool bVar15;
  byte bVar16;
  bool cb_adf_option;
  string type_string;
  size_type __dnew_4;
  size_type __dnew;
  option_group_definition new_options;
  size_type __dnew_2;
  size_type __dnew_1;
  size_type __dnew_3;
  bool local_459;
  options_i *local_458;
  cb_adf *local_450;
  vw *local_448;
  int local_43c;
  bool *local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  _func_int ***local_410;
  _func_int **local_408;
  _func_int **local_400 [2];
  long local_3f0;
  undefined1 local_3e8 [112];
  bool local_378;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  _func_int ***local_348;
  _func_int **local_340;
  _func_int **local_338 [2];
  _func_int ***local_328;
  _func_int **local_320;
  _func_int **local_318 [2];
  _func_int ***local_308;
  _func_int **local_300;
  _func_int **local_2f8 [2];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  option_group_definition local_288;
  undefined1 local_250 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar16 = 0;
  local_458 = options;
  local_448 = all;
  pcVar7 = calloc_or_throw<CB_ADF::cb_adf>(1);
  memset(pcVar7,0,0x168);
  local_459 = false;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity._0_4_ = 0x72746d;
  local_430._M_string_length = 3;
  local_3e8._0_8_ = (_func_int **)0x30;
  local_450 = pcVar7;
  local_410 = local_400;
  local_410 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_410,(ulong)local_3e8);
  local_400[0] = (_func_int **)local_3e8._0_8_;
  local_410[4] = (_func_int **)0x20746e65646e6570;
  local_410[5] = (_func_int **)0x7365727574616546;
  local_410[2] = (_func_int **)0x4120687469772074;
  local_410[3] = (_func_int **)0x6544206e6f697463;
  *(undefined4 *)local_410 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_410 + 4),"extu",4);
  *(undefined4 *)(local_410 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_410 + 0xc),"andi",4);
  local_408 = (_func_int **)local_3e8._0_8_;
  *(char *)((long)local_410 + local_3e8._0_8_) = '\0';
  local_288.m_name._M_dataplus._M_p = (pointer)&local_288.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_410,(char *)(local_3e8._0_8_ + (long)local_410));
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_410 != local_400) {
    operator_delete(local_410);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8.field_2._M_allocated_capacity._0_4_ = 0x615f6263;
  local_2a8.field_2._M_allocated_capacity._4_2_ = 0x6664;
  local_2a8._M_string_length = 6;
  local_2a8.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e8,&local_2a8,&local_459);
  local_378 = true;
  local_308 = local_2f8;
  local_170._0_8_ = (_func_int **)0x47;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)local_170);
  uVar4 = local_170._0_8_;
  local_2f8[0] = (_func_int **)local_170._0_8_;
  local_308 = __dest;
  memcpy(__dest,"Do Contextual Bandit learning with multiline action dependent features.",0x47);
  local_300 = (_func_int **)uVar4;
  *(undefined1 *)((long)__dest + uVar4) = 0;
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_288,(typed_option<bool> *)local_3e8);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity = 0x6c6c615f6b6e6172;
  local_2c8._M_string_length = 8;
  local_2c8.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_2c8,&pcVar7->rank_all);
  local_100 = true;
  local_328 = local_318;
  local_250._0_8_ = (_func_int **)0x24;
  local_328 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)local_250);
  local_318[0] = (_func_int **)local_250._0_8_;
  local_328[2] = (_func_int **)0x796220646574726f;
  local_328[3] = (_func_int **)0x6f2065726f637320;
  *local_328 = (_func_int **)0x61206e7275746552;
  local_328[1] = (_func_int **)0x7320736e6f697463;
  *(undefined4 *)(local_328 + 4) = 0x72656472;
  local_320 = (_func_int **)local_250._0_8_;
  *(char *)((long)local_328 + local_250._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar8,(typed_option<bool> *)local_170);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8.field_2._M_allocated_capacity = 0x69646572705f6f6e;
  local_2e8.field_2._8_2_ = 0x7463;
  local_2e8._M_string_length = 10;
  local_2e8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_250,&local_2e8,&pcVar7->no_predict);
  local_348 = local_338;
  local_d0._0_8_ = (_func_int **)0x24;
  local_348 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_d0);
  local_338[0] = (_func_int **)local_d0._0_8_;
  local_348[2] = (_func_int **)0x77206e6f69746369;
  local_348[3] = (_func_int **)0x69617274206e6568;
  *local_348 = (_func_int **)0x6420746f6e206f44;
  local_348[1] = (_func_int **)0x646572702061206f;
  *(undefined4 *)(local_348 + 4) = 0x676e696e;
  local_340 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_348 + local_d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_250 + 0x30));
  poVar8 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar8,(typed_option<bool> *)local_250);
  local_190.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_190.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_190._M_string_length = 7;
  local_190.field_2._M_local_buf[7] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_190,&local_430);
  local_60 = true;
  local_3f0 = 0x47;
  local_438 = &pcVar7->rank_all;
  local_1b0 = local_1a0;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1b0,(ulong)&local_3f0);
  lVar10 = local_3f0;
  local_1a0[0] = local_3f0;
  local_1b0 = __dest_00;
  memcpy(__dest_00,"contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr",0x47);
  local_1a8 = lVar10;
  *(undefined1 *)((long)__dest_00 + lVar10) = 0;
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar8,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_d0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  pcVar7 = local_450;
  local_d0._0_8_ = &PTR__typed_option_002da680;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  local_250._0_8_ = &PTR__typed_option_002da618;
  if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
  }
  if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  local_170._0_8_ = &PTR__typed_option_002da618;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  local_3e8._0_8_ = &PTR__typed_option_002da618;
  if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
  }
  if (local_360._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  (**local_458->_vptr_options_i)(local_458,&local_288);
  if (local_459 == false) {
    plVar9 = (learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0025573c;
  }
  pp_Var2 = (_func_int **)(local_3e8 + 0x10);
  local_3e8._16_4_ = 0x745f6263;
  local_3e8[0x14] = 0x79;
  local_3e8._21_2_ = 0x6570;
  local_3e8._8_8_ = (pointer)0x7;
  local_3e8[0x17] = 0;
  local_3e8._0_8_ = pp_Var2;
  iVar5 = (*local_458->_vptr_options_i[1])(local_458,local_3e8);
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  pcVar7 = local_450;
  if ((char)iVar5 == '\0') {
    local_3e8._16_4_ = 0x745f6263;
    local_3e8[0x14] = 0x79;
    local_3e8._21_2_ = 0x6570;
    local_3e8._8_8_ = (pointer)0x7;
    local_3e8[0x17] = 0;
    local_3e8._0_8_ = pp_Var2;
    (*local_458->_vptr_options_i[5])(local_458,local_3e8,&local_430);
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    (**local_458->_vptr_options_i)(local_458,&local_288);
  }
  pcVar7->all = local_448;
  local_43c = std::__cxx11::string::compare((char *)&local_430);
  if (local_43c == 0) {
    ws = 2;
    sVar13 = 0;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_430);
    if (iVar5 == 0) {
      ws = 1;
      sVar13 = 2;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_430);
      sVar13 = 3;
      if (iVar5 == 0) {
        ws = 1;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_430);
        if (iVar5 == 0) {
          ws = 1;
          sVar13 = 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_430);
          ws = 1;
          if (iVar5 == 0) {
            sVar13 = 4;
          }
          else {
            pvVar1 = &local_448->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,
                       "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\',\'sm\'}; resetting to mtr."
                       ,0x4b);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
          }
        }
      }
    }
  }
  (local_450->gen_cs).cb_type = sVar13;
  local_448->delete_prediction = ACTION_SCORE::delete_action_scores;
  local_3e8._16_4_ = 0x616f7363;
  local_3e8[0x14] = 0x61;
  local_3e8._21_2_ = 0x6c5f;
  local_3e8[0x17] = 100;
  local_3e8[0x18] = 'f';
  local_3e8[0x19] = '\0';
  local_3e8._8_8_ = (pointer)0x9;
  local_3e8._0_8_ = pp_Var2;
  iVar5 = (*local_458->_vptr_options_i[1])();
  if ((char)iVar5 == '\0') {
    local_170._0_8_ = local_170 + 0x10;
    local_170._16_4_ = 0x5f706177;
    local_170._20_3_ = 0x66646c;
    local_170._8_8_ = (pointer)0x7;
    local_170[0x17] = 0;
    iVar6 = (*local_458->_vptr_options_i[1])(local_458,local_170);
    bVar14 = 1;
    if (((char)iVar6 != '\0') && (*local_438 == false)) goto LAB_00255399;
LAB_002553f7:
    if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
      operator_delete((void *)local_170._0_8_);
    }
  }
  else {
    bVar14 = 1;
    if (*local_438 == false) {
LAB_00255399:
      local_250._16_8_ = 0x61725f61616f7363;
      local_250._24_2_ = 0x6b6e;
      local_250._8_8_ = (pointer)0xa;
      local_250[0x1a] = '\0';
      local_250._0_8_ = local_250 + 0x10;
      iVar6 = (*local_458->_vptr_options_i[1])(local_458,local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_);
      }
      bVar14 = (byte)iVar6 ^ 1;
      if ((char)iVar5 == '\0') goto LAB_002553f7;
    }
  }
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  if (bVar14 != 0) {
    local_3e8._16_4_ = 0x616f7363;
    local_3e8[0x14] = 0x61;
    local_3e8._21_2_ = 0x6c5f;
    local_3e8[0x17] = 100;
    local_3e8[0x18] = 'f';
    local_3e8[0x19] = '\0';
    local_3e8._8_8_ = (pointer)0x9;
    local_3e8._0_8_ = pp_Var2;
    iVar5 = (*local_458->_vptr_options_i[1])();
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    if ((char)iVar5 == '\0') {
      local_3e8._16_4_ = 0x616f7363;
      local_3e8[0x14] = 0x61;
      local_3e8._21_2_ = 0x6c5f;
      local_3e8[0x17] = 100;
      local_3e8[0x18] = 'f';
      local_3e8[0x19] = '\0';
      local_3e8._8_8_ = (pointer)0x9;
      local_250._16_8_ = 0x6e696c69746c756d;
      local_250._24_2_ = 0x65;
      local_250._8_8_ = (pointer)0x9;
      local_3e8._0_8_ = pp_Var2;
      local_250._0_8_ = local_250 + 0x10;
      (*local_458->_vptr_options_i[5])(local_458,local_3e8,local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_);
      }
      if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
    local_3e8._16_4_ = 0x616f7363;
    local_3e8[0x14] = 0x61;
    local_3e8._21_2_ = 0x725f;
    local_3e8[0x17] = 0x61;
    local_3e8[0x18] = 'n';
    local_3e8[0x19] = 'k';
    local_3e8._8_8_ = (pointer)0xa;
    local_3e8[0x1a] = '\0';
    local_3e8._0_8_ = pp_Var2;
    iVar5 = (*local_458->_vptr_options_i[1])();
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
    if ((char)iVar5 == '\0') {
      local_3e8._16_4_ = 0x616f7363;
      local_3e8[0x14] = 0x61;
      local_3e8._21_2_ = 0x725f;
      local_3e8[0x17] = 0x61;
      local_3e8[0x18] = 'n';
      local_3e8[0x19] = 'k';
      local_3e8._8_8_ = (pointer)0xa;
      local_3e8[0x1a] = '\0';
      local_250._8_8_ = (pointer)0x0;
      local_250._16_8_ = local_250._16_8_ & 0xffffffffffffff00;
      local_3e8._0_8_ = pp_Var2;
      local_250._0_8_ = local_250 + 0x10;
      (*local_458->_vptr_options_i[5])(local_458,local_3e8,local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_);
      }
      if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
        operator_delete((void *)local_3e8._0_8_);
      }
    }
  }
  local_3e8._16_4_ = 0x65736162;
  local_3e8[0x14] = 0x6c;
  local_3e8._21_2_ = 0x6e69;
  local_3e8[0x17] = 0x65;
  local_3e8._8_8_ = (pointer)0x8;
  local_3e8[0x18] = '\0';
  local_3e8._0_8_ = pp_Var2;
  iVar5 = (*local_458->_vptr_options_i[1])();
  bVar15 = local_43c == 0;
  if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
    operator_delete((void *)local_3e8._0_8_);
  }
  pcVar7 = local_450;
  if ((bVar15 & (byte)iVar5) != 0) {
    local_3e8._16_4_ = 0x63656863;
    local_3e8[0x14] = 0x6b;
    local_3e8._21_2_ = 0x655f;
    local_3e8[0x17] = 0x6e;
    local_3e8[0x18] = 'a';
    local_3e8[0x19] = 'b';
    local_3e8[0x1a] = 'l';
    local_3e8._27_2_ = 0x6465;
    local_3e8._8_8_ = (pointer)0xd;
    local_3e8[0x1d] = '\0';
    local_250._8_8_ = (pointer)0x0;
    local_250._16_8_ = local_250._16_8_ & 0xffffffffffffff00;
    local_3e8._0_8_ = pp_Var2;
    local_250._0_8_ = local_250 + 0x10;
    (*local_458->_vptr_options_i[5])(local_458,local_3e8,local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_);
    }
    if ((_func_int **)local_3e8._0_8_ != pp_Var2) {
      operator_delete((void *)local_3e8._0_8_);
    }
  }
  pvVar3 = local_448;
  l = setup_base(local_458,local_448);
  base = LEARNER::as_multiline<char,char>(l);
  ppuVar11 = &CB::cb_label;
  plVar12 = &pvVar3->p->lp;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    plVar12->default_label = (_func_void_void_ptr *)*ppuVar11;
    ppuVar11 = ppuVar11 + (ulong)bVar16 * -2 + 1;
    plVar12 = (label_parser *)((long)plVar12 + (ulong)bVar16 * -0x10 + 8);
  }
  pvVar3->label_type = cb;
  plVar9 = LEARNER::learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (pcVar7,base,CB_ADF::do_actual_learning<true>,CB_ADF::do_actual_learning<false>
                      ,ws,action_scores);
  *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
  *(code **)(plVar9 + 0x68) = CB_ADF::finish_multiline_example;
  (pcVar7->gen_cs).scorer = pvVar3->scorer;
  *(undefined8 *)(plVar9 + 0xb8) = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
  *(code **)(plVar9 + 200) = CB_ADF::finish;
  *(code **)(plVar9 + 0x80) = CB_ADF::save_load;
  *(undefined8 *)(plVar9 + 0x70) = *(undefined8 *)(plVar9 + 0x18);
  *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
  pcVar7 = (cb_adf *)0x0;
LAB_0025573c:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_288.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
    operator_delete(local_288.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (pcVar7 != (cb_adf *)0x0) {
    destroy_free<CB_ADF::cb_adf>(pcVar7);
  }
  return (base_learner *)plVar9;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "mtr";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else if (type_string.compare("sm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_SM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm','sm'}; resetting to mtr." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}